

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttRawValue
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *value,XMLBuffer *toFill)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  bool bVar4;
  XMLCh XVar5;
  
  toFill->fIndex = 0;
  bVar4 = true;
  XVar2 = 0;
  do {
    XVar1 = *value;
    if (XVar1 == L'<') {
      bVar4 = false;
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      XVar2 = toFill->fIndex;
LAB_002a565d:
      XVar3 = XVar2;
      XVar5 = L' ';
      if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                     [(ushort)XVar1]) {
        XVar5 = XVar1;
      }
    }
    else {
      if (XVar1 != L'\xffff') {
        if (XVar1 == L'\0') {
          return bVar4;
        }
        goto LAB_002a565d;
      }
      XVar5 = value[1];
      value = value + 1;
      XVar3 = XVar2;
    }
    if (XVar3 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar3 = toFill->fIndex;
    }
    XVar2 = XVar3 + 1;
    toFill->fIndex = XVar2;
    toFill->fBuffer[XVar3] = XVar5;
    value = value + 1;
  } while( true );
}

Assistant:

bool IGXMLScanner::normalizeAttRawValue( const   XMLCh* const        attrName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    bool escaped;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;
    while (*srcPtr)
    {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        nextCh = *srcPtr;
        escaped = (nextCh == 0xFFFF);
        if (escaped)
            nextCh = *++srcPtr;

        //  If its not escaped, then make sure its not a < character, which is
        //  not allowed in attribute values.
        if (!escaped && (*srcPtr == chOpenAngle))
        {
            emitError(XMLErrs::BracketInAttrValue, attrName);
            retVal = false;
        }

        if (!escaped)
        {
            //  NOTE: Yes this is a little redundant in that a 0x20 is
            //  replaced with an 0x20. But its faster to do this (I think)
            //  than checking for 9, A, and D separately.
            if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                nextCh = chSpace;
        }

        // Add this char to the target buffer
        toFill.append(nextCh);

        // And move up to the next character in the source
        srcPtr++;
    }
    return retVal;
}